

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int flatbuffers::FromUTF8(char **in)

{
  char *pcVar1;
  int local_28;
  uint local_24;
  int i;
  int ucc;
  int mask;
  int len;
  char **in_local;
  
  ucc = 0;
  for (i = 0x80; (3 < (uint)i && ((**in & i) != 0)); i = i >> 1) {
    ucc = ucc + 1;
  }
  if (((uint)(byte)**in << ((byte)ucc & 0x1f) & 0x80) == 0) {
    if (ucc == 0) {
      pcVar1 = *in;
      *in = pcVar1 + 1;
      in_local._4_4_ = (uint)*pcVar1;
    }
    else if ((ucc < 2) || (4 < ucc)) {
      in_local._4_4_ = 0xffffffff;
    }
    else {
      pcVar1 = *in;
      *in = pcVar1 + 1;
      local_24 = (int)*pcVar1 & (1 << (7 - (byte)ucc & 0x1f)) - 1U;
      for (local_28 = 0; local_28 < ucc + -1; local_28 = local_28 + 1) {
        if (((int)**in & 0xc0U) != 0x80) {
          return -1;
        }
        pcVar1 = *in;
        *in = pcVar1 + 1;
        local_24 = (int)*pcVar1 & 0x3fU | local_24 << 6;
      }
      if (((int)local_24 < 0xd800) || (0xdfff < (int)local_24)) {
        if (ucc == 2) {
          if (((int)local_24 < 0x80) || (0x7ff < (int)local_24)) {
            return -1;
          }
        }
        else if (ucc == 3) {
          if (((int)local_24 < 0x800) || (0xffff < (int)local_24)) {
            return -1;
          }
        }
        else if ((ucc == 4) && (((int)local_24 < 0x10000 || (0x10ffff < (int)local_24)))) {
          return -1;
        }
        in_local._4_4_ = local_24;
      }
      else {
        in_local._4_4_ = 0xffffffff;
      }
    }
  }
  else {
    in_local._4_4_ = 0xffffffff;
  }
  return in_local._4_4_;
}

Assistant:

inline int FromUTF8(const char **in) {
  int len = 0;
  // Count leading 1 bits.
  for (int mask = 0x80; mask >= 0x04; mask >>= 1) {
    if (**in & mask) {
      len++;
    } else {
      break;
    }
  }
  if ((static_cast<unsigned char>(**in) << len) & 0x80)
    return -1;  // Bit after leading 1's must be 0.
  if (!len) return *(*in)++;
  // UTF-8 encoded values with a length are between 2 and 4 bytes.
  if (len < 2 || len > 4) { return -1; }
  // Grab initial bits of the code.
  int ucc = *(*in)++ & ((1 << (7 - len)) - 1);
  for (int i = 0; i < len - 1; i++) {
    if ((**in & 0xC0) != 0x80) return -1;  // Upper bits must 1 0.
    ucc <<= 6;
    ucc |= *(*in)++ & 0x3F;  // Grab 6 more bits of the code.
  }
  // UTF-8 cannot encode values between 0xD800 and 0xDFFF (reserved for
  // UTF-16 surrogate pairs).
  if (ucc >= 0xD800 && ucc <= 0xDFFF) { return -1; }
  // UTF-8 must represent code points in their shortest possible encoding.
  switch (len) {
    case 2:
      // Two bytes of UTF-8 can represent code points from U+0080 to U+07FF.
      if (ucc < 0x0080 || ucc > 0x07FF) { return -1; }
      break;
    case 3:
      // Three bytes of UTF-8 can represent code points from U+0800 to U+FFFF.
      if (ucc < 0x0800 || ucc > 0xFFFF) { return -1; }
      break;
    case 4:
      // Four bytes of UTF-8 can represent code points from U+10000 to U+10FFFF.
      if (ucc < 0x10000 || ucc > 0x10FFFF) { return -1; }
      break;
  }
  return ucc;
}